

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_textedit_paste(nk_text_edit *state,char *ctext,int len)

{
  short sVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = 0;
  if (state->mode != '\0') {
    nk_textedit_clamp(state);
    nk_textedit_delete_selection(state);
    iVar2 = nk_utf_len(ctext,len);
    iVar3 = nk_str_insert_text_utf8(&state->string,state->cursor,ctext,len);
    if (iVar3 == 0) {
      sVar1 = (state->undo).undo_point;
      iVar2 = 0;
      if (sVar1 != 0) {
        (state->undo).undo_point = sVar1 + -1;
      }
    }
    else {
      nk_textedit_createundo(&state->undo,state->cursor,0,iVar2);
      state->cursor = state->cursor + len;
      state->has_preferred_x = '\0';
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

NK_API int
nk_textedit_paste(struct nk_text_edit *state, char const *ctext, int len)
{
    /* API paste: replace existing selection with passed-in text */
    int glyphs;
    const char *text = (const char *) ctext;
    if (state->mode == NK_TEXT_EDIT_MODE_VIEW) return 0;

    /* if there's a selection, the paste should delete it */
    nk_textedit_clamp(state);
    nk_textedit_delete_selection(state);

    /* try to insert the characters */
    glyphs = nk_utf_len(ctext, len);
    if (nk_str_insert_text_char(&state->string, state->cursor, text, len)) {
        nk_textedit_makeundo_insert(state, state->cursor, glyphs);
        state->cursor += len;
        state->has_preferred_x = 0;
        return 1;
    }
    /* remove the undo since we didn't actually insert the characters */
    if (state->undo.undo_point)
        --state->undo.undo_point;
    return 0;
}